

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

int32_t bf_get_int32_le(bfile_t *bfile)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int8_t iVar4;
  bfile_t *in_RDI;
  int32_t val;
  bfile_t *in_stack_ffffffffffffffe8;
  
  uVar1 = bf_get_uint8(in_RDI);
  uVar2 = bf_get_uint8(in_RDI);
  uVar3 = bf_get_uint8(in_RDI);
  iVar4 = bf_get_int8(in_stack_ffffffffffffffe8);
  return CONCAT13(iVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

int32_t
bf_get_int32_le(
    bfile_t * bfile )
{
    int32_t val;
    val = bf_get_uint8( bfile );
    val |= bf_get_uint8( bfile ) << 8;
    val |= bf_get_uint8( bfile ) << 16;
    val |= bf_get_int8( bfile ) << 24;
    return val;
}